

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerBox.cpp
# Opt level: O3

void __thiscall
Rml::ContainerBox::ContainerBox
          (ContainerBox *this,Type type,Element *element,ContainerBox *parent_container)

{
  bool bVar1;
  ComputedValues *pCVar2;
  
  (this->super_LayoutBox).type = type;
  (this->super_LayoutBox).visible_overflow_size.x = 0.0;
  (this->super_LayoutBox).visible_overflow_size.y = 0.0;
  (this->super_LayoutBox)._vptr_LayoutBox = (_func_int **)&PTR__ContainerBox_00333068;
  this->element = element;
  (this->absolute_elements).m_container.
  super__Vector_base<std::pair<Rml::Element_*,_Rml::ContainerBox::AbsoluteElement>,_std::allocator<std::pair<Rml::Element_*,_Rml::ContainerBox::AbsoluteElement>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->absolute_elements).m_container.
  super__Vector_base<std::pair<Rml::Element_*,_Rml::ContainerBox::AbsoluteElement>,_std::allocator<std::pair<Rml::Element_*,_Rml::ContainerBox::AbsoluteElement>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->absolute_elements).m_container.
  super__Vector_base<std::pair<Rml::Element_*,_Rml::ContainerBox::AbsoluteElement>,_std::allocator<std::pair<Rml::Element_*,_Rml::ContainerBox::AbsoluteElement>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->relative_elements).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relative_elements).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->relative_elements).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   ((long)&(this->relative_elements).
           super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 7) = 0;
  this->parent_container = parent_container;
  if (element != (Element *)0x0) {
    pCVar2 = Element::GetComputedValues(element);
    this->overflow_x = (Overflow)(*(uint *)&pCVar2->common >> 10) & Scroll;
    this->overflow_y = (Overflow)(*(uint *)&pCVar2->common >> 0xc) & Scroll;
    bVar1 = true;
    if (((undefined1  [96])((undefined1  [96])pCVar2->common & (undefined1  [96])0x30) ==
         (undefined1  [96])0x0) && ((*(uint *)&pCVar2->rare & 0xc000300) == 0)) {
      bVar1 = (bool)((byte)(*(uint *)&pCVar2->rare >> 0x19) & 1);
    }
    this->is_absolute_positioning_containing_block = bVar1;
  }
  return;
}

Assistant:

void ContainerBox::AddRelativeElement(Element* element)
{
	// The same relative element may be added multiple times during repeated layout iterations, avoid any duplicates.
	if (std::find(relative_elements.begin(), relative_elements.end(), element) == relative_elements.end())
		relative_elements.push_back(element);
}